

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printMessage(AssertionPrinter *this)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  pointer pMVar4;
  undefined8 *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  string *in_stack_000000d8;
  Text *in_stack_000000e0;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_ffffffffffffff28;
  Text *in_stack_ffffffffffffff30;
  Text *_text;
  ostream *in_stack_ffffffffffffff50;
  undefined1 local_90 [120];
  MessageInfo *local_18;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_10 [2];
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)*in_RDI,(string *)(in_RDI + 8));
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,"\n");
  }
  local_10[0]._M_current =
       (MessageInfo *)
       std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                 (in_stack_ffffffffffffff28);
  local_18 = (MessageInfo *)
             std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                       (in_stack_ffffffffffffff28);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) {
      return;
    }
    if ((*(byte *)(in_RDI + 0x13) & 1) == 0) {
      pMVar4 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator->(local_10);
      if (pMVar4->type != Info) goto LAB_0027542d;
    }
    else {
LAB_0027542d:
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator->(local_10);
      in_stack_ffffffffffffff30 = (Text *)local_90;
      Tbc::TextAttributes::TextAttributes((TextAttributes *)in_stack_ffffffffffffff30);
      Tbc::TextAttributes::setIndent((TextAttributes *)in_stack_ffffffffffffff30,2);
      _text = (Text *)(local_90 + 0x20);
      Tbc::Text::Text(in_stack_000000e0,in_stack_000000d8,(TextAttributes *)this);
      in_stack_ffffffffffffff50 = Tbc::operator<<(in_stack_ffffffffffffff50,_text);
      std::operator<<(in_stack_ffffffffffffff50,"\n");
      Tbc::Text::~Text(in_stack_ffffffffffffff30);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(local_10);
  } while( true );
}

Assistant:

void printMessage() const {
                if( !messageLabel.empty() )
                    stream << messageLabel << ":" << "\n";
                for( std::vector<MessageInfo>::const_iterator it = messages.begin(), itEnd = messages.end();
                        it != itEnd;
                        ++it ) {
                    // If this assertion is a warning ignore any INFO messages
                    if( printInfoMessages || it->type != ResultWas::Info )
                        stream << Text( it->message, TextAttributes().setIndent(2) ) << "\n";
                }
            }